

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isIntegral(Value *this)

{
  bool local_29;
  Value *this_local;
  
  if ((byte)this->field_0x8 - 1 < 2) {
    this_local._7_1_ = true;
  }
  else if ((byte)this->field_0x8 == 3) {
    local_29 = false;
    if ((-9.223372036854776e+18 <= (this->value_).real_) &&
       (local_29 = false,
       (this->value_).real_ <= 1.8446744073709552e+19 &&
       (this->value_).real_ != 1.8446744073709552e+19)) {
      local_29 = IsIntegral((this->value_).real_);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::isIntegral() const {
  switch (type_) {
    case intValue:
    case uintValue:
      return true;
    case realValue:
#if defined(JSON_HAS_INT64)
      // Note that maxUInt64 (= 2^64 - 1) is not exactly representable as a
      // double, so double(maxUInt64) will be rounded up to 2^64. Therefore we
      // require the value to be strictly less than the limit.
      return value_.real_ >= double(minInt64) && value_.real_ < maxUInt64AsDouble && IsIntegral(value_.real_);
#else
      return value_.real_ >= minInt && value_.real_ <= maxUInt && IsIntegral(value_.real_);
#endif // JSON_HAS_INT64
    default:
      break;
  }
  return false;
}